

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O3

vector<double,_std::allocator<double>_> *
calc_kurtosis_all_data<InputData<float,long>,long_double>
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          InputData<float,_long> *input_data,ModelParams *model_params,Xoshiro256PP *rnd_generator)

{
  int iVar1;
  size_t sVar2;
  float *pfVar3;
  long *Xc_indptr;
  double *pdVar4;
  double *pdVar5;
  double *buffer_prob;
  long lVar6;
  double *pdVar7;
  ulong uVar8;
  vector<double,_std::allocator<double>_> *__range1;
  ulong uVar9;
  double dVar10;
  allocator_type local_41;
  double *local_40;
  size_t *local_38;
  
  sVar2 = input_data->ncols_categ;
  if (sVar2 == 0) {
    local_38 = (size_t *)0x0;
    buffer_prob = (double *)0x0;
  }
  else {
    iVar1 = input_data->max_categ;
    lVar6 = (long)iVar1;
    uVar8 = lVar6 * 8;
    if (lVar6 < 0) {
      uVar8 = 0xffffffffffffffff;
    }
    buffer_prob = (double *)operator_new__(uVar8);
    local_40 = buffer_prob;
    if ((input_data->sample_weights == (float *)0x0) || (input_data->weight_as_sample == true)) {
      uVar8 = lVar6 * 8 + 8;
      if (iVar1 < -1) {
        uVar8 = 0xffffffffffffffff;
      }
      local_38 = (size_t *)operator_new__(uVar8);
      buffer_prob = local_40;
    }
    else {
      local_38 = (size_t *)0x0;
    }
  }
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,sVar2 + input_data->ncols_numeric,&local_41);
  if (input_data->ncols_tot == 0) {
    uVar8 = 0;
  }
  else {
    uVar9 = 0;
    do {
      uVar8 = input_data->ncols_numeric;
      if (uVar9 < uVar8) {
        pfVar3 = input_data->sample_weights;
        Xc_indptr = input_data->Xc_indptr;
        if (Xc_indptr == (long *)0x0) {
          if ((pfVar3 == (float *)0x0) || (input_data->weight_as_sample == true)) {
            dVar10 = calc_kurtosis<float,long_double>
                               (input_data->numeric_data + input_data->nrows * uVar9,
                                input_data->nrows,model_params->missing_action);
          }
          else {
            dVar10 = calc_kurtosis_weighted<float,long_double>
                               (input_data->numeric_data + input_data->nrows * uVar9,
                                input_data->nrows,model_params->missing_action,pfVar3);
          }
        }
        else if ((pfVar3 == (float *)0x0) || (input_data->weight_as_sample == true)) {
          dVar10 = calc_kurtosis<float,long,long_double>
                             (uVar9,input_data->nrows,input_data->Xc,input_data->Xc_ind,Xc_indptr,
                              model_params->missing_action);
        }
        else {
          dVar10 = calc_kurtosis_weighted<float,long,long_double>
                             (uVar9,input_data->nrows,input_data->Xc,input_data->Xc_ind,Xc_indptr,
                              model_params->missing_action,pfVar3);
        }
      }
      else if ((input_data->sample_weights == (float *)0x0) ||
              (input_data->weight_as_sample == true)) {
        dVar10 = calc_kurtosis<long_double>
                           (input_data->nrows,
                            input_data->categ_data + (uVar9 - uVar8) * input_data->nrows,
                            input_data->ncat[uVar9 - uVar8],local_38,buffer_prob,
                            model_params->missing_action,model_params->cat_split_type,rnd_generator)
        ;
      }
      else {
        dVar10 = calc_kurtosis_weighted<float,long_double>
                           (input_data->nrows,
                            input_data->categ_data + (uVar9 - uVar8) * input_data->nrows,
                            input_data->ncat[uVar9 - uVar8],buffer_prob,model_params->missing_action
                            ,model_params->cat_split_type,rnd_generator,input_data->sample_weights);
      }
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar9] = dVar10;
      uVar9 = uVar9 + 1;
      uVar8 = input_data->ncols_tot;
    } while (uVar9 < uVar8);
  }
  pdVar5 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar4 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (pdVar7 = pdVar4; pdVar7 != pdVar5; pdVar7 = pdVar7 + 1) {
    dVar10 = 0.0;
    if ((-INFINITY < *pdVar7) && (dVar10 = *pdVar7 + -1.0, dVar10 <= 1e-08)) {
      dVar10 = 1e-08;
    }
    *pdVar7 = dVar10;
  }
  pfVar3 = input_data->col_weights;
  if (uVar8 != 0 && pfVar3 != (float *)0x0) {
    uVar9 = 0;
    do {
      if (0.0 < pdVar4[uVar9]) {
        dVar10 = pdVar4[uVar9] * (double)pfVar3[uVar9];
        if (dVar10 <= 1e-100) {
          dVar10 = 1e-100;
        }
        pdVar4[uVar9] = dVar10;
      }
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if (local_38 != (size_t *)0x0) {
    operator_delete__(local_38);
  }
  if (buffer_prob != (double *)0x0) {
    operator_delete__(buffer_prob);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> calc_kurtosis_all_data(InputData &input_data, ModelParams &model_params, RNG_engine &rnd_generator)
{
    std::unique_ptr<double[]> buffer_double;
    std::unique_ptr<size_t[]> buffer_size_t;
    if (input_data.ncols_categ)
    {
        buffer_double = std::unique_ptr<double[]>(new double[input_data.max_categ]);
        if (!(input_data.sample_weights != NULL && !input_data.weight_as_sample))
            buffer_size_t = std::unique_ptr<size_t[]>(new size_t[input_data.max_categ + 1]);
    }


    std::vector<double> kurt_weights(input_data.ncols_numeric + input_data.ncols_categ);
    for (size_t col = 0; col < input_data.ncols_tot; col++)
    {
        if (col < input_data.ncols_numeric)
        {
            if (input_data.Xc_indptr == NULL)
            {
                if (!(input_data.sample_weights != NULL && !input_data.weight_as_sample))
                {
                    kurt_weights[col]
                        = calc_kurtosis<typename std::remove_pointer<decltype(input_data.numeric_data)>::type, ldouble_safe>(
                                        input_data.numeric_data + col * input_data.nrows,
                                        input_data.nrows, model_params.missing_action);
                }

                else
                {
                    kurt_weights[col]
                        = calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.numeric_data)>::type,
                                                 ldouble_safe>(
                                                 input_data.numeric_data + col * input_data.nrows, input_data.nrows,
                                                 model_params.missing_action, input_data.sample_weights);
                }
            }

            else
            {
                if (!(input_data.sample_weights != NULL && !input_data.weight_as_sample))
                {
                    kurt_weights[col]
                        = calc_kurtosis<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                        typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                        ldouble_safe>(
                                        col, input_data.nrows,
                                        input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                        model_params.missing_action);
                }

                else
                {
                    kurt_weights[col]
                        = calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                                 typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                                 ldouble_safe>(
                                                 col, input_data.nrows,
                                                 input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                                 model_params.missing_action, input_data.sample_weights);
                }
            }
        }

        else
        {
            if (!(input_data.sample_weights != NULL && !input_data.weight_as_sample))
            {
                kurt_weights[col]
                        = calc_kurtosis<ldouble_safe>(input_data.nrows,
                                        input_data.categ_data + (col- input_data.ncols_numeric) * input_data.nrows,
                                        input_data.ncat[col - input_data.ncols_numeric],
                                        buffer_size_t.get(), buffer_double.get(),
                                        model_params.missing_action, model_params.cat_split_type, rnd_generator);
            }

            else
            {
                kurt_weights[col]
                        = calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.sample_weights)>::type,
                                                 ldouble_safe>(
                                                 input_data.nrows,
                                                 input_data.categ_data + (col- input_data.ncols_numeric) * input_data.nrows,
                                                 input_data.ncat[col - input_data.ncols_numeric],
                                                 buffer_double.get(),
                                                 model_params.missing_action, model_params.cat_split_type,
                                                 rnd_generator, input_data.sample_weights);
            }
        }
    }

    for (auto &w : kurt_weights) w = (w == -HUGE_VAL)? 0. : std::fmax(1e-8, -1. + w);
    if (input_data.col_weights != NULL)
    {
        for (size_t col = 0; col < input_data.ncols_tot; col++)
        {
            if (kurt_weights[col] <= 0) continue;
            kurt_weights[col] *= input_data.col_weights[col];
            kurt_weights[col] = std::fmax(kurt_weights[col], 1e-100);
        }
    }

    return kurt_weights;
}